

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_constant(Parser *parser)

{
  Kind KVar1;
  uint row;
  uint col;
  Token *name;
  char *file;
  KindMeta KVar2;
  Token *tok;
  Parser *parser_local;
  
  name = parser->token;
  KVar1 = name->kind;
  if (((KVar1 == ID) || (KVar1 == NUMBER)) || (KVar1 == FLOAT)) {
    move(parser);
    parser_local = (Parser *)new_constant_term(name);
  }
  else {
    log_debug(
             "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:697"
             );
    file = parser->lexer->source;
    row = parser->token->row_pos;
    col = parser->token->col_pos;
    KVar2 = get_kind_meta(name->kind);
    log_code(file,row,col,"Illegal expression: %s",KVar2.name);
  }
  return parser_local;
}

Assistant:

void *parse_constant(Parser *parser) {
    Token *tok = token(parser);
    switch (g_kind(tok)) {
        case NUMBER:
        case FLOAT:
        case ID:
            move(parser);
            return new_constant_term(tok);
        default:
            parse_error(parser, "Illegal expression: %s", get_kind_meta(tok->kind).name);
    }
}